

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_stbvorbis_init_internal_decoder_push(ma_stbvorbis *pVorbis)

{
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var1;
  ma_result mVar2;
  uchar *data;
  _func_void_void_ptr_void_ptr *p_Var3;
  ma_uint8 *pmVar4;
  ma_result unaff_R13D;
  size_t sVar5;
  int iVar6;
  size_t sVar7;
  int consumedDataSize;
  int vorbisError;
  size_t bytesRead;
  ulong local_58;
  stb_vorbis *local_48;
  int local_40;
  int local_3c;
  size_t local_38;
  
  local_58 = 0;
  pmVar4 = (ma_uint8 *)0x0;
  sVar7 = 0x1000;
  do {
    sVar5 = sVar7;
    p_Var1 = (pVorbis->allocationCallbacks).onRealloc;
    if (p_Var1 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      data = (uchar *)0x0;
    }
    else {
      data = (uchar *)(*p_Var1)(pmVar4,sVar5,(pVorbis->allocationCallbacks).pUserData);
    }
    if (data == (uchar *)0x0) {
      iVar6 = 1;
      unaff_R13D = MA_OUT_OF_MEMORY;
      data = pmVar4;
      if ((pmVar4 != (ma_uint8 *)0x0) &&
         (p_Var3 = (pVorbis->allocationCallbacks).onFree,
         p_Var3 != (_func_void_void_ptr_void_ptr *)0x0)) {
        (*p_Var3)(pmVar4,(pVorbis->allocationCallbacks).pUserData);
      }
    }
    else {
      mVar2 = (*pVorbis->onRead)(pVorbis->pReadSeekTellUserData,data + local_58,sVar5 - local_58,
                                 &local_38);
      local_58 = local_58 + local_38;
      if (mVar2 == MA_SUCCESS) {
        if (local_58 >> 0x1f == 0) {
          local_48 = stb_vorbis_open_pushdata
                               (data,(int)local_58,&local_40,&local_3c,(stb_vorbis_alloc *)0x0);
          if (local_48 == (stb_vorbis *)0x0) {
            if (local_3c == 1) {
              iVar6 = 3;
            }
            else {
              p_Var3 = (pVorbis->allocationCallbacks).onFree;
              iVar6 = 1;
              unaff_R13D = MA_ERROR;
              if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0) {
                (*p_Var3)(data,(pVorbis->allocationCallbacks).pUserData);
              }
            }
            local_48 = (stb_vorbis *)0x0;
          }
          else {
            sVar7 = (size_t)local_40;
            local_58 = local_58 - sVar7;
            memmove(data,data + sVar7,local_58);
            (pVorbis->push).audioStartOffsetInBytes = sVar7;
            iVar6 = 2;
          }
          goto LAB_0016f03b;
        }
        p_Var3 = (pVorbis->allocationCallbacks).onFree;
        unaff_R13D = MA_TOO_BIG;
      }
      else {
        p_Var3 = (pVorbis->allocationCallbacks).onFree;
        unaff_R13D = mVar2;
      }
      iVar6 = 1;
      if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0) {
        (*p_Var3)(data,(pVorbis->allocationCallbacks).pUserData);
      }
    }
LAB_0016f03b:
    pmVar4 = data;
    sVar7 = sVar5 + 0x1000;
    if (iVar6 != 3) {
      if (iVar6 == 2) {
        pVorbis->stb = local_48;
        (pVorbis->push).pData = data;
        (pVorbis->push).dataSize = local_58;
        (pVorbis->push).dataCapacity = sVar5;
        unaff_R13D = MA_SUCCESS;
      }
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

static ma_result ma_stbvorbis_init_internal_decoder_push(ma_stbvorbis* pVorbis)
{
    ma_result result;
    stb_vorbis* stb;
    size_t dataSize = 0;
    size_t dataCapacity = 0;
    ma_uint8* pData = NULL; /* <-- Must be initialized to NULL. */

    for (;;) {
        int vorbisError;
        int consumedDataSize;   /* <-- Fill by stb_vorbis_open_pushdata(). */
        size_t bytesRead;
        ma_uint8* pNewData;

        /* Allocate memory for the new chunk. */
        dataCapacity += MA_VORBIS_DATA_CHUNK_SIZE;
        pNewData = (ma_uint8*)ma_realloc(pData, dataCapacity, &pVorbis->allocationCallbacks);
        if (pNewData == NULL) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return MA_OUT_OF_MEMORY;
        }

        pData = pNewData;

        /* Read in the next chunk. */
        result = pVorbis->onRead(pVorbis->pReadSeekTellUserData, ma_offset_ptr(pData, dataSize), (dataCapacity - dataSize), &bytesRead);
        dataSize += bytesRead;

        if (result != MA_SUCCESS) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return result;
        }

        /* We have a maximum of 31 bits with stb_vorbis. */
        if (dataSize > INT_MAX) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return MA_TOO_BIG;
        }

        stb = stb_vorbis_open_pushdata(pData, (int)dataSize, &consumedDataSize, &vorbisError, NULL);
        if (stb != NULL) {
            /*
            Successfully opened the Vorbis decoder. We might have some leftover unprocessed
            data so we'll need to move that down to the front.
            */
            dataSize -= (size_t)consumedDataSize;   /* Consume the data. */
            MA_MOVE_MEMORY(pData, ma_offset_ptr(pData, consumedDataSize), dataSize);

            /*
            We need to track the start point so we can seek back to the start of the audio
            data when seeking.
            */
            pVorbis->push.audioStartOffsetInBytes = consumedDataSize;

            break;
        } else {
            /* Failed to open the decoder. */
            if (vorbisError == VORBIS_need_more_data) {
                continue;
            } else {
                ma_free(pData, &pVorbis->allocationCallbacks);
                return MA_ERROR;   /* Failed to open the stb_vorbis decoder. */
            }
        }
    }

    MA_ASSERT(stb != NULL);
    pVorbis->stb = stb;
    pVorbis->push.pData = pData;
    pVorbis->push.dataSize = dataSize;
    pVorbis->push.dataCapacity = dataCapacity;

    return MA_SUCCESS;
}